

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O2

string * Assimp::FBX::Util::AddLineAndColumn
                   (string *__return_storage_ptr__,string *prefix,string *text,uint line,uint column
                   )

{
  ostringstream aoStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  std::operator<<((ostream *)aoStack_1a8,(string *)prefix);
  std::operator<<((ostream *)aoStack_1a8," (line ");
  std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
  std::operator<<((ostream *)aoStack_1a8," <<  col ");
  std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
  std::operator<<((ostream *)aoStack_1a8,") ");
  std::operator<<((ostream *)aoStack_1a8,(string *)text);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string AddLineAndColumn(const std::string& prefix, const std::string& text, unsigned int line, unsigned int column)
{
    return static_cast<std::string>( (Formatter::format() << prefix << " (line " << line << " <<  col " << column << ") " << text) );
}